

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O3

uint32 gflags::ParseCommandLineFlagsInternal
                 (int *argc,char ***argv,bool remove_flags,bool do_report)

{
  uint uVar1;
  Mutex *pMVar2;
  char **__dest;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  int iVar4;
  size_type sVar5;
  char cVar6;
  bool bVar7;
  FlagRegistry *pFVar8;
  CommandLineFlag *flag;
  char *pcVar9;
  char *pcVar10;
  size_t sVar11;
  mapped_type *pmVar12;
  undefined8 *puVar13;
  long *plVar14;
  _Base_ptr p_Var15;
  _Base_ptr p_Var16;
  undefined7 in_register_00000009;
  long *plVar17;
  size_type *psVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  **ppaVar19;
  ulong *puVar20;
  undefined7 in_register_00000011;
  uint32 uVar21;
  char ***pppcVar22;
  char *pcVar23;
  uint uVar24;
  string key;
  string error_message;
  char *value;
  CommandLineFlagParser parser;
  key_type local_218;
  long *local_1f8;
  long local_1f0;
  long local_1e8;
  long lStack_1e0;
  FlagRegistry *local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  **local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c0;
  undefined8 uStack_1b8;
  char ***local_1b0;
  string local_1a8;
  key_type local_188;
  undefined4 local_168;
  undefined4 local_164;
  char *local_160;
  long *local_158;
  long local_150;
  long local_148;
  long lStack_140;
  undefined4 *local_138;
  undefined8 local_130;
  undefined4 local_128;
  undefined3 uStack_124;
  undefined1 local_121;
  CommandLineFlagParser local_118;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_1d8 = (FlagRegistry *)argc;
  local_1b0 = argv;
  SetArgv(*argc,*argv);
  pFVar8 = anon_unknown_2::FlagRegistry::GlobalRegistry();
  local_118.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_118.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_118.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_118.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_118.error_flags_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_118.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_118.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_118.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_118.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_118.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pMVar2 = &pFVar8->lock_;
  iVar4 = pMVar2->mutex_;
  pMVar2->mutex_ = pMVar2->mutex_ + -1;
  local_118.registry_ = pFVar8;
  local_118.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_118.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_118.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_118.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (iVar4 == 0) {
    anon_unknown_2::CommandLineFlagParser::ProcessFlagfileLocked
              (&local_50,&local_118,fLS::FLAGS_flagfile_abi_cxx11_,SET_FLAGS_VALUE);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    anon_unknown_2::CommandLineFlagParser::ProcessFromenvLocked
              (&local_70,&local_118,fLS::FLAGS_fromenv_abi_cxx11_,SET_FLAGS_VALUE,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    anon_unknown_2::CommandLineFlagParser::ProcessFromenvLocked
              (&local_90,&local_118,fLS::FLAGS_tryfromenv_abi_cxx11_,SET_FLAGS_VALUE,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    pMVar2 = &pFVar8->lock_;
    pMVar2->mutex_ = pMVar2->mutex_ + 1;
    if (pMVar2->mutex_ != 0) {
LAB_0010b51b:
      __assert_fail("mutex_++ == -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/jarulraj[P]sqlcheck/external/gflags/src/mutex.h"
                    ,0xdf,"void gflags_mutex_namespace::Mutex::Unlock()");
    }
    uVar21 = *(uint32 *)&(local_1d8->flags_)._M_t._M_impl;
    pMVar2 = &(local_118.registry_)->lock_;
    iVar4 = pMVar2->mutex_;
    pMVar2->mutex_ = pMVar2->mutex_ + -1;
    if (iVar4 == 0) {
      local_168 = (undefined4)CONCAT71(in_register_00000011,remove_flags);
      local_164 = (undefined4)CONCAT71(in_register_00000009,do_report);
      pppcVar22 = local_1b0;
      if (1 < (int)uVar21) {
        uVar24 = 1;
        do {
          pFVar8 = local_1d8;
          pcVar23 = (*pppcVar22)[(int)uVar24];
          if (*pcVar23 == '-') {
            cVar6 = pcVar23[1];
            if (cVar6 == '-') {
              cVar6 = pcVar23[2];
              pcVar23 = pcVar23 + 2;
            }
            else {
              if (cVar6 == '\0') goto LAB_0010a95c;
              pcVar23 = pcVar23 + 1;
            }
            if (cVar6 == '\0') {
              uVar21 = uVar24 + 1;
              break;
            }
            local_218._M_string_length = 0;
            local_218.field_2._M_allocated_capacity =
                 local_218.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_1a8._M_string_length = 0;
            local_1a8.field_2._M_allocated_capacity =
                 local_1a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
            local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
            flag = anon_unknown_2::FlagRegistry::SplitArgumentLocked
                             (local_118.registry_,pcVar23,&local_218,&local_160,&local_1a8);
            if (flag == (CommandLineFlag *)0x0) {
              pmVar12 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[](&local_118.undefined_names_,&local_218);
              std::__cxx11::string::_M_replace
                        ((ulong)pmVar12,0,(char *)pmVar12->_M_string_length,0x115124);
              pmVar12 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[](&local_118.error_flags_,&local_218);
              bVar7 = false;
              std::__cxx11::string::_M_assign((string *)pmVar12);
            }
            else {
              pcVar23 = local_160;
              if (local_160 == (char *)0x0) {
                cVar6 = flag->defvalue_->type_;
                if (cVar6 == '\0') {
                  __assert_fail("flag->Type() != FlagValue::FV_BOOL",
                                "/workspace/llm4binary/github/license_c_cmakelists/jarulraj[P]sqlcheck/external/gflags/src/gflags.cc"
                                ,0x42d,
                                "uint32 gflags::(anonymous namespace)::CommandLineFlagParser::ParseNewCommandLineFlags(int *, char ***, bool)"
                               );
                }
                uVar1 = uVar24 + 1;
                if ((int)uVar21 <= (int)uVar1) {
                  local_138 = &local_128;
                  uStack_124 = 0x203a52;
                  local_128 = 0x4f525245;
                  local_130 = 7;
                  local_121 = 0;
                  plVar14 = (long *)std::__cxx11::string::append((char *)&local_138);
                  local_158 = &local_148;
                  plVar17 = plVar14 + 2;
                  if ((long *)*plVar14 == plVar17) {
                    local_148 = *plVar17;
                    lStack_140 = plVar14[3];
                  }
                  else {
                    local_148 = *plVar17;
                    local_158 = (long *)*plVar14;
                  }
                  local_150 = plVar14[1];
                  *plVar14 = (long)plVar17;
                  plVar14[1] = 0;
                  *(undefined1 *)(plVar14 + 2) = 0;
                  plVar14 = (long *)std::__cxx11::string::append((char *)&local_158);
                  psVar18 = (size_type *)(plVar14 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar14 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar18) {
                    local_188.field_2._M_allocated_capacity = *psVar18;
                    local_188.field_2._8_8_ = plVar14[3];
                    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                  }
                  else {
                    local_188.field_2._M_allocated_capacity = *psVar18;
                    local_188._M_dataplus._M_p = (pointer)*plVar14;
                  }
                  local_188._M_string_length = plVar14[1];
                  *plVar14 = (long)psVar18;
                  plVar14[1] = 0;
                  *(undefined1 *)(plVar14 + 2) = 0;
                  puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
                  ppaVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              **)(puVar13 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       **)*puVar13 == ppaVar19) {
                    local_1c0 = *ppaVar19;
                    uStack_1b8 = puVar13[3];
                    local_1d0 = &local_1c0;
                  }
                  else {
                    local_1c0 = *ppaVar19;
                    local_1d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 **)*puVar13;
                  }
                  local_1c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)puVar13[1];
                  *puVar13 = ppaVar19;
                  puVar13[1] = 0;
                  *(undefined1 *)(puVar13 + 2) = 0;
                  plVar14 = (long *)std::__cxx11::string::append((char *)&local_1d0);
                  local_1f8 = &local_1e8;
                  plVar17 = plVar14 + 2;
                  if ((long *)*plVar14 == plVar17) {
                    local_1e8 = *plVar17;
                    lStack_1e0 = plVar14[3];
                  }
                  else {
                    local_1e8 = *plVar17;
                    local_1f8 = (long *)*plVar14;
                  }
                  local_1f0 = plVar14[1];
                  *plVar14 = (long)plVar17;
                  plVar14[1] = 0;
                  *(undefined1 *)(plVar14 + 2) = 0;
                  pmVar12 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator[](&local_118.error_flags_,&local_218);
                  std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_1f8);
                  if (local_1f8 != &local_1e8) {
                    operator_delete(local_1f8);
                  }
                  if (local_1d0 != &local_1c0) {
                    operator_delete(local_1d0);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_188._M_dataplus._M_p != &local_188.field_2) {
                    operator_delete(local_188._M_dataplus._M_p);
                  }
                  if (local_158 != &local_148) {
                    operator_delete(local_158);
                  }
                  if (local_138 != &local_128) {
                    operator_delete(local_138);
                  }
                  if ((flag->help_ != (char *)0x0) && ('\x01' < *flag->help_)) {
                    local_188._M_dataplus._M_p = (pointer)0x14;
                    local_1d0 = &local_1c0;
                    local_1d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 **)std::__cxx11::string::_M_create
                                              ((ulong *)&local_1d0,(ulong)&local_188);
                    local_1c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_188._M_dataplus._M_p;
                    *local_1d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)0x642067616c66203b;
                    local_1d0[1] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                    *)0x6974706972637365;
                    *(undefined4 *)(local_1d0 + 2) = 0x203a6e6f;
                    local_1c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_188._M_dataplus._M_p;
                    *(char *)((long)local_1d0 + (long)local_188._M_dataplus._M_p) = '\0';
                    puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d0);
                    plVar14 = puVar13 + 2;
                    if ((long *)*puVar13 == plVar14) {
                      local_1e8 = *plVar14;
                      lStack_1e0 = puVar13[3];
                      local_1f8 = &local_1e8;
                    }
                    else {
                      local_1e8 = *plVar14;
                      local_1f8 = (long *)*puVar13;
                    }
                    local_1f0 = puVar13[1];
                    *puVar13 = plVar14;
                    puVar13[1] = 0;
                    *(undefined1 *)(puVar13 + 2) = 0;
                    pmVar12 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::operator[](&local_118.error_flags_,&local_218);
                    std::__cxx11::string::_M_append((char *)pmVar12,(ulong)local_1f8);
                    if (local_1f8 != &local_1e8) {
                      operator_delete(local_1f8);
                    }
                    if (local_1d0 != &local_1c0) {
                      operator_delete(local_1d0);
                    }
                  }
                  pmVar12 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator[](&local_118.error_flags_,&local_218);
                  bVar7 = true;
                  std::__cxx11::string::append((char *)pmVar12);
                  goto LAB_0010af31;
                }
                pcVar23 = (*local_1b0)[(int)uVar1];
                uVar24 = uVar1;
                local_160 = pcVar23;
                if ((cVar6 == '\x06') && (*pcVar23 == '-')) {
                  pcVar10 = flag->help_;
                  pcVar9 = strstr(pcVar10,"true");
                  if ((pcVar9 != (char *)0x0) ||
                     (pcVar10 = strstr(pcVar10,"false"), pcVar10 != (char *)0x0)) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"Did you really mean to set flag \'",0x21);
                    pcVar10 = flag->name_;
                    if (pcVar10 == (char *)0x0) {
                      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x11b2d0);
                    }
                    else {
                      sVar11 = strlen(pcVar10);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,pcVar10,sVar11);
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"\' to the value \'",0x10);
                    sVar11 = strlen(pcVar23);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,pcVar23,sVar11);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"\'?",2);
                  }
                }
              }
              (anonymous_namespace)::CommandLineFlagParser::ProcessSingleOptionLocked_abi_cxx11_
                        (&local_b0,&local_118,flag,pcVar23,SET_FLAGS_VALUE);
              bVar7 = false;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                operator_delete(local_b0._M_dataplus._M_p);
              }
            }
LAB_0010af31:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
              operator_delete(local_1a8._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._M_dataplus._M_p != &local_218.field_2) {
              operator_delete(local_218._M_dataplus._M_p);
            }
            pppcVar22 = local_1b0;
            if (bVar7) break;
          }
          else {
LAB_0010a95c:
            __dest = *pppcVar22 + (int)uVar24;
            memmove(__dest,__dest + 1,
                    (long)(int)(~uVar24 + *(int *)&(local_1d8->flags_)._M_t._M_impl) << 3);
            (*pppcVar22)[(long)*(int *)&(pFVar8->flags_)._M_t._M_impl + -1] = pcVar23;
            uVar21 = uVar21 - 1;
            uVar24 = uVar24 - 1;
          }
          uVar24 = uVar24 + 1;
        } while ((int)uVar24 < (int)uVar21);
      }
      pMVar2 = &(local_118.registry_)->lock_;
      pMVar2->mutex_ = pMVar2->mutex_ + 1;
      if (pMVar2->mutex_ != 0) goto LAB_0010b51b;
      if ((char)local_168 != '\0') {
        (*pppcVar22)[(long)(int)uVar21 + -1] = **pppcVar22;
        *pppcVar22 = *pppcVar22 + (long)(int)uVar21 + -1;
        *(uint32 *)&(local_1d8->flags_)._M_t._M_impl =
             (*(int *)&(local_1d8->flags_)._M_t._M_impl - uVar21) + 1;
        uVar21 = 1;
      }
      if ((char)local_164 != '\0') {
        HandleCommandLineHelpFlags();
      }
      pMVar2 = &(local_118.registry_)->lock_;
      iVar4 = pMVar2->mutex_;
      pMVar2->mutex_ = pMVar2->mutex_ + -1;
      if (iVar4 == 0) {
        p_Var16 = ((local_118.registry_)->flags_)._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_left;
        if ((_Rb_tree_header *)p_Var16 ==
            &((local_118.registry_)->flags_)._M_t._M_impl.super__Rb_tree_header) {
          ((local_118.registry_)->lock_).mutex_ = 0;
        }
        else {
          local_1d8 = local_118.registry_;
          this = &local_118.error_flags_;
          do {
            p_Var15 = p_Var16[1]._M_parent;
            if ((*(char *)&p_Var15->_M_right == '\0') &&
               (bVar7 = anon_unknown_2::CommandLineFlag::Validate
                                  (*(CommandLineFlag **)p_Var15,(FlagValue *)p_Var15[1]._M_left),
               !bVar7)) {
              std::__cxx11::string::string
                        ((string *)&local_218,*(char **)p_Var16[1]._M_parent,(allocator *)&local_1a8
                        );
              pmVar12 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[](this,&local_218);
              sVar5 = pmVar12->_M_string_length;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._M_dataplus._M_p != &local_218.field_2) {
                operator_delete(local_218._M_dataplus._M_p);
              }
              paVar3 = &local_218.field_2;
              if (sVar5 == 0) {
                local_1d0 = &local_1c0;
                local_1c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x203a524f525245;
                local_1c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x7;
                puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d0);
                local_1f8 = &local_1e8;
                plVar14 = puVar13 + 2;
                if ((long *)*puVar13 == plVar14) {
                  local_1e8 = *plVar14;
                  lStack_1e0 = puVar13[3];
                }
                else {
                  local_1e8 = *plVar14;
                  local_1f8 = (long *)*puVar13;
                }
                local_1f0 = puVar13[1];
                *puVar13 = plVar14;
                puVar13[1] = 0;
                *(undefined1 *)(puVar13 + 2) = 0;
                plVar14 = (long *)std::__cxx11::string::append((char *)&local_1f8);
                local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                puVar20 = (ulong *)(plVar14 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar14 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar20) {
                  local_1a8.field_2._M_allocated_capacity = *puVar20;
                  local_1a8.field_2._8_8_ = plVar14[3];
                }
                else {
                  local_1a8.field_2._M_allocated_capacity = *puVar20;
                  local_1a8._M_dataplus._M_p = (pointer)*plVar14;
                }
                local_1a8._M_string_length = plVar14[1];
                *plVar14 = (long)puVar20;
                plVar14[1] = 0;
                *(undefined1 *)(plVar14 + 2) = 0;
                plVar14 = (long *)std::__cxx11::string::append((char *)&local_1a8);
                puVar20 = (ulong *)(plVar14 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar14 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar20) {
                  local_218.field_2._M_allocated_capacity = *puVar20;
                  local_218.field_2._8_8_ = plVar14[3];
                  local_218._M_dataplus._M_p = (pointer)paVar3;
                }
                else {
                  local_218.field_2._M_allocated_capacity = *puVar20;
                  local_218._M_dataplus._M_p = (pointer)*plVar14;
                }
                local_218._M_string_length = plVar14[1];
                *plVar14 = (long)puVar20;
                plVar14[1] = 0;
                *(undefined1 *)(plVar14 + 2) = 0;
                std::__cxx11::string::string
                          ((string *)&local_188,*(char **)p_Var16[1]._M_parent,
                           (allocator *)&local_158);
                pmVar12 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator[](this,&local_188);
                std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_218);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_188._M_dataplus._M_p != &local_188.field_2) {
                  operator_delete(local_188._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218._M_dataplus._M_p != paVar3) {
                  operator_delete(local_218._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                  operator_delete(local_1a8._M_dataplus._M_p);
                }
                if (local_1f8 != &local_1e8) {
                  operator_delete(local_1f8);
                }
                if (local_1d0 != &local_1c0) {
                  operator_delete(local_1d0);
                }
                p_Var15 = p_Var16[1]._M_parent;
                if (*(char *)&p_Var15->_M_right == '\0') {
                  std::__cxx11::string::string
                            ((string *)&local_218,*(char **)p_Var15,(allocator *)&local_1a8);
                  pmVar12 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator[](this,&local_218);
                  std::__cxx11::string::append((char *)pmVar12);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_218._M_dataplus._M_p != paVar3) {
                    operator_delete(local_218._M_dataplus._M_p);
                  }
                  p_Var15 = p_Var16[1]._M_parent;
                }
                std::__cxx11::string::string
                          ((string *)&local_218,*(char **)p_Var15,(allocator *)&local_1a8);
                pmVar12 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator[](this,&local_218);
                std::__cxx11::string::append((char *)pmVar12);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218._M_dataplus._M_p != paVar3) {
                  operator_delete(local_218._M_dataplus._M_p);
                }
              }
            }
            p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
          } while ((_Rb_tree_header *)p_Var16 !=
                   &((local_118.registry_)->flags_)._M_t._M_impl.super__Rb_tree_header);
          pMVar2 = &local_1d8->lock_;
          pMVar2->mutex_ = pMVar2->mutex_ + 1;
          if (pMVar2->mutex_ != 0) goto LAB_0010b51b;
        }
        bVar7 = anon_unknown_2::CommandLineFlagParser::ReportErrors(&local_118);
        if (!bVar7) {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&local_118.undefined_names_._M_t);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&local_118.error_flags_._M_t);
          return uVar21;
        }
        uVar21 = (*(code *)gflags_exitfunc)(1);
        return uVar21;
      }
    }
  }
  __assert_fail("--mutex_ == -1",
                "/workspace/llm4binary/github/license_c_cmakelists/jarulraj[P]sqlcheck/external/gflags/src/mutex.h"
                ,0xde,"void gflags_mutex_namespace::Mutex::Lock()");
}

Assistant:

static uint32 ParseCommandLineFlagsInternal(int* argc, char*** argv,
                                            bool remove_flags, bool do_report) {
  SetArgv(*argc, const_cast<const char**>(*argv));    // save it for later

  FlagRegistry* const registry = FlagRegistry::GlobalRegistry();
  CommandLineFlagParser parser(registry);

  // When we parse the commandline flags, we'll handle --flagfile,
  // --tryfromenv, etc. as we see them (since flag-evaluation order
  // may be important).  But sometimes apps set FLAGS_tryfromenv/etc.
  // manually before calling ParseCommandLineFlags.  We want to evaluate
  // those too, as if they were the first flags on the commandline.
  registry->Lock();
  parser.ProcessFlagfileLocked(FLAGS_flagfile, SET_FLAGS_VALUE);
  // Last arg here indicates whether flag-not-found is a fatal error or not
  parser.ProcessFromenvLocked(FLAGS_fromenv, SET_FLAGS_VALUE, true);
  parser.ProcessFromenvLocked(FLAGS_tryfromenv, SET_FLAGS_VALUE, false);
  registry->Unlock();

  // Now get the flags specified on the commandline
  const int r = parser.ParseNewCommandLineFlags(argc, argv, remove_flags);

  if (do_report)
    HandleCommandLineHelpFlags();   // may cause us to exit on --help, etc.

  // See if any of the unset flags fail their validation checks
  parser.ValidateUnmodifiedFlags();

  if (parser.ReportErrors())        // may cause us to exit on illegal flags
    gflags_exitfunc(1);
  return r;
}